

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O3

bool duckdb::Exception::InvalidatesTransaction(ExceptionType exception_type)

{
  return (bool)((byte)(0xbfedf9fff >> (exception_type & (INVALID_INPUT|INTERNAL))) & 1 |
               PARAMETER_NOT_ALLOWED < exception_type);
}

Assistant:

bool Exception::InvalidatesTransaction(ExceptionType exception_type) {
	switch (exception_type) {
	case ExceptionType::BINDER:
	case ExceptionType::CATALOG:
	case ExceptionType::CONNECTION:
	case ExceptionType::PARAMETER_NOT_ALLOWED:
	case ExceptionType::PARSER:
	case ExceptionType::PERMISSION:
		return false;
	default:
		return true;
	}
}